

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O0

int SUNLogger_SetInfoFilename(SUNLogger logger,char *info_filename)

{
  int iVar1;
  char *in_RSI;
  SUNLogger in_RDI;
  int local_4;
  
  if (in_RDI == (SUNLogger)0x0) {
    local_4 = -1;
  }
  else {
    iVar1 = sunLoggerIsOutputRank(in_RDI,(int *)0x0);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      if (in_RSI != (char *)0x0) {
        iVar1 = strcmp(in_RSI,"");
        if (iVar1 != 0) {
          fprintf(_stderr,
                  "[LOGGER WARNING] SUNDIALS_LOGGING_LEVEL=%d (build time option) is set too low for INFO, but a INFO file was provided. Set the logging level to >= %d and recompile if INFO output level is desired.\n"
                  ,3,0);
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int SUNLogger_SetInfoFilename(SUNLogger logger, const char* info_filename)
{
  if (logger == NULL)
  {
    return -1;
  }

  if (!sunLoggerIsOutputRank(logger, NULL))
  {
    return 0;
  }

  if (info_filename && strcmp(info_filename, ""))
  {
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    FILE* fp = NULL;
    if (!SUNHashMap_GetValue(logger->filenames, info_filename, (void*)&fp))
    {
      logger->info_fp = fp;
    }
    else
    {
      logger->info_fp = sunOpenLogFile(info_filename, "w+");
      if (logger->info_fp)
      {
        SUNHashMap_Insert(logger->filenames, info_filename,
                          (void*)logger->info_fp);
      }
      else
      {
        return -1;
      }
    }
#else
    fprintf(stderr,
            "[LOGGER WARNING] "
            "SUNDIALS_LOGGING_LEVEL=%d (build time option) "
            "is set too low for INFO, but a INFO file was provided. Set the "
            "logging level to >= %d and recompile if INFO output level is "
            "desired.\n", SUN_LOGLEVEL_INFO, SUNDIALS_LOGGING_LEVEL);
#endif
  }

  return 0;
}